

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall
Alg::opimb_naive(Alg *this,Graph *graph,double budget,
                vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                int mode)

{
  size_t sVar1;
  uint uVar2;
  ResultInfo *this_00;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double approxOPIMC;
  double upperOPT;
  double lowerSelect;
  double upperDegOPT;
  double upperBound;
  double degVldt;
  double infVldt;
  double infSelf;
  size_t numR;
  byte bStack_110;
  int satisfy_count;
  size_t idx;
  double timeb;
  double time2;
  double time1;
  double a2;
  double a1;
  size_t numIter;
  size_t theta_max;
  size_t theta_zero;
  int targetSize_max;
  int targetSize_min;
  int local_a8;
  int k_min;
  vector<double,_std::allocator<double>_> local_98;
  int local_7c;
  double dStack_78;
  int k_max;
  double alpha;
  double approx;
  double e_alpha;
  Timer timerOPIMC;
  int mode_local;
  double delta_local;
  double epsilon_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  Alg *this_local;
  
  timerOPIMC.__processName._4_4_ = mode;
  Timer::Timer((Timer *)&e_alpha,"OPIM-B-NAIVE");
  poVar5 = std::operator<<((ostream *)&std::cout,"mode: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,timerOPIMC.__processName._4_4_);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  approx = exp(1.0);
  alpha = (1.0 - 1.0 / approx) * 0.5;
  dVar8 = log(6.0 / delta);
  dStack_78 = sqrt(dVar8);
  std::vector<double,_std::allocator<double>_>::vector(&local_98,budget_list);
  iVar4 = cal_k_max(&local_98,budget);
  std::vector<double,_std::allocator<double>_>::~vector(&local_98);
  local_7c = iVar4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&targetSize_max,budget_list);
  iVar4 = cal_k_min((vector<double,_std::allocator<double>_> *)&targetSize_max,budget);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&targetSize_max);
  local_a8 = iVar4;
  dVar8 = max_vector(budget_list);
  theta_zero._4_4_ = (int)(budget / dVar8);
  dVar8 = min_vector_nonzero(budget_list);
  theta_zero._0_4_ = (int)(budget / dVar8);
  poVar5 = std::operator<<((ostream *)&std::cout,"k_max: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_7c);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"k_min: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"targetSize_max: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)theta_zero);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"targetSize_min: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,theta_zero._4_4_);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  dVar8 = dStack_78;
  dVar9 = (double)this->__numV;
  dVar14 = (1.0 - 1.0 / approx) * 0.5;
  dVar15 = (double)local_7c;
  dVar10 = log(dVar9);
  dVar11 = log(6.0 / delta);
  dVar10 = sqrt(dVar14 * (dVar15 * dVar10 + dVar11));
  dVar10 = pow2(dVar14 * dVar8 + dVar10);
  dVar8 = dStack_78;
  dVar9 = ((dVar9 + dVar9) * dVar10) / (double)this->__numV;
  uVar7 = (ulong)dVar9;
  theta_max = uVar7 | (long)(dVar9 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f;
  dVar9 = (double)this->__numV;
  dVar14 = (1.0 - 1.0 / approx) * 0.5;
  dVar15 = (double)local_7c;
  dVar10 = log(dVar9);
  dVar11 = log(6.0 / delta);
  dVar10 = sqrt(dVar14 * (dVar15 * dVar10 + dVar11));
  dVar8 = pow2(dVar14 * dVar8 + dVar10);
  dVar10 = pow2(epsilon);
  dVar8 = ((dVar9 + dVar9) * dVar8) / (dVar10 * (double)local_7c);
  uVar7 = (ulong)dVar8;
  dVar8 = dVar8 - 9.223372036854776e+18;
  numIter = uVar7 | (long)dVar8 & (long)uVar7 >> 0x3f;
  dVar8 = log2(dVar8);
  a1 = (double)(((long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f) + 1);
  auVar12._8_4_ = (int)((ulong)a1 >> 0x20);
  auVar12._0_8_ = a1;
  auVar12._12_4_ = 0x45300000;
  a2 = log((((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(a1,0)) - 4503599627370496.0)) * 3.0) / delta);
  auVar13._8_4_ = (int)((ulong)a1 >> 0x20);
  auVar13._0_8_ = a1;
  auVar13._12_4_ = 0x45300000;
  time1 = log((((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(a1,0)) - 4503599627370496.0)) * 3.0) / delta);
  time2 = 0.0;
  timeb = 0.0;
  idx = 0;
  _bStack_110 = 0;
  bVar3 = false;
  while( true ) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_bStack_110);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    sVar6 = theta_max << (bStack_110 & 0x3f);
    Timer::get_operation_time((Timer *)&e_alpha);
    HyperGraph::build_n_RRsets(&this->__hyperG,sVar6);
    HyperGraph::build_n_RRsets(&this->__hyperGVldt,sVar6);
    poVar5 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    sVar6 = HyperGraph::get_RR_sets_size(&this->__hyperG);
    this->__numRRsets = sVar6;
    dVar8 = Timer::get_operation_time((Timer *)&e_alpha);
    time2 = time2 + dVar8;
    dVar8 = max_cover_budget(this,graph,budget,budget_list,(double *)&idx,
                             timerOPIMC.__processName._4_4_);
    dVar9 = Timer::get_operation_time((Timer *)&e_alpha);
    timeb = timeb + dVar9;
    dVar9 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    sVar6 = this->__numRRsets;
    auVar16._8_4_ = (int)(sVar6 >> 0x20);
    auVar16._0_8_ = sVar6;
    auVar16._12_4_ = 0x45300000;
    dVar10 = dVar8 / alpha;
    sVar1 = this->__numRRsets;
    auVar17._8_4_ = (int)(sVar1 >> 0x20);
    auVar17._0_8_ = sVar1;
    auVar17._12_4_ = 0x45300000;
    uVar2 = this->__numV;
    dVar11 = sqrt((dVar9 * ((auVar16._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0))) /
                  (double)this->__numV + (a2 * 2.0) / 9.0);
    dVar14 = sqrt(a2 / 2.0);
    dVar11 = pow2(dVar11 - dVar14);
    upperOPT = dVar11 - a2 / 18.0;
    if (upperOPT < 0.0) {
      upperOPT = 0.0;
    }
    dVar11 = sqrt((dVar10 * ((auVar17._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) /
                  (double)uVar2 + time1 / 2.0);
    dVar14 = sqrt(time1 / 2.0);
    dVar11 = pow2(dVar11 + dVar14);
    dVar11 = upperOPT / dVar11;
    poVar5 = std::operator<<((ostream *)&std::cout," -->OPIM-B-NAIVE (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,_bStack_110 + 1);
    poVar5 = std::operator<<(poVar5,"/");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)a1);
    poVar5 = std::operator<<(poVar5,") approx. (max-cover): ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
    poVar5 = std::operator<<(poVar5," (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar8 / dVar10);
    poVar5 = std::operator<<(poVar5,"), #RR sets: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->__numRRsets);
    std::operator<<(poVar5,'\n');
    if ((alpha - epsilon <= dVar11) && (bVar3)) break;
    if ((alpha - epsilon <= dVar11) && (!bVar3)) {
      bVar3 = true;
    }
    _bStack_110 = _bStack_110 + 1;
  }
  ResultInfo::set_approximation(this->__tRes,dVar11);
  this_00 = this->__tRes;
  dVar10 = Timer::get_total_time((Timer *)&e_alpha);
  ResultInfo::set_running_time(this_00,dVar10);
  ResultInfo::set_influence(this->__tRes,dVar9);
  ResultInfo::set_influence_original(this->__tRes,dVar8);
  ResultInfo::set_seed_vec(this->__tRes,&this->__vecSeed);
  ResultInfo::set_seed_inf_vec(this->__tRes,&this->__vecSeed_inf);
  ResultInfo::set_seed_inf_cost_vec(this->__tRes,&this->__vecSeed_inf_cost);
  ResultInfo::set_boundmin_inf(this->__tRes,this->__boundMin_inf);
  ResultInfo::set_boundmin_inf_cost(this->__tRes,this->__boundMin_inf_cost);
  ResultInfo::set_RR_sets_size(this->__tRes,this->__numRRsets << 1);
  poVar5 = std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar9);
  poVar5 = std::operator<<(poVar5,", time: ");
  dVar8 = ResultInfo::get_running_time(this->__tRes);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar8);
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,time2);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,timeb - (double)idx);
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)idx);
  std::operator<<(poVar5,'\n');
  return 0.0;
}

Assistant:

double Alg::opimb_naive(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-NAIVE");
    std::cout << "mode: " << mode << std::endl;
    const double e_alpha = exp(1);
    const double approx = 0.5 * (1 - 1.0 / e_alpha);
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    int targetSize_min = int(budget / max_vector(budget_list));
    int targetSize_max = int(budget / min_vector_nonzero(budget_list));
    std::cout << "k_max: " << k_max << std::endl;
    std::cout << "k_min: " << k_min << std::endl;
    std::cout << "targetSize_max: " << targetSize_max << std::endl;
    std::cout << "targetSize_min: " << targetSize_min << std::endl;
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    size_t idx = 0;
    int satisfy_count = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-NAIVE (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}